

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O0

int x25519_init_key(EVP_HPKE_KEY *key,uint8_t *priv_key,size_t priv_key_len)

{
  size_t priv_key_len_local;
  uint8_t *priv_key_local;
  EVP_HPKE_KEY *key_local;
  
  if (priv_key_len == 0x20) {
    OPENSSL_memcpy(key->private_key,priv_key,0x20);
    X25519_public_from_private(key->public_key,priv_key);
  }
  else {
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                  ,0x9a);
  }
  key_local._4_4_ = (uint)(priv_key_len == 0x20);
  return key_local._4_4_;
}

Assistant:

static int x25519_init_key(EVP_HPKE_KEY *key, const uint8_t *priv_key,
                           size_t priv_key_len) {
  if (priv_key_len != X25519_PRIVATE_KEY_LEN) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  OPENSSL_memcpy(key->private_key, priv_key, priv_key_len);
  X25519_public_from_private(key->public_key, priv_key);
  return 1;
}